

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

uint __thiscall
CVmObjIterLookupTable::find_first_valid_entry(CVmObjIterLookupTable *this,uint entry)

{
  uint uVar1;
  CVmObject *this_00;
  vm_lookup_ext *this_01;
  vm_lookup_val *pvVar2;
  uint in_ESI;
  vm_lookup_val *entryp;
  vm_val_t coll;
  CVmObjLookupTable *ltab;
  vm_val_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_14;
  
  get_coll_val((CVmObjIterLookupTable *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
  this_00 = vm_objp(0);
  uVar3 = in_ESI;
  uVar1 = CVmObjLookupTable::get_entry_count((CVmObjLookupTable *)0x316bac);
  local_14 = in_ESI;
  if (uVar3 <= uVar1) {
    while (uVar3 = local_14,
          uVar1 = CVmObjLookupTable::get_entry_count((CVmObjLookupTable *)0x316bd4), uVar3 <= uVar1)
    {
      this_01 = CVmObjLookupTable::get_ext((CVmObjLookupTable *)this_00);
      pvVar2 = vm_lookup_ext::idx_to_val(this_01,local_14 - 1);
      if ((pvVar2->key).typ != VM_EMPTY) {
        return local_14;
      }
      local_14 = local_14 + 1;
    }
  }
  return 0;
}

Assistant:

uint CVmObjIterLookupTable::find_first_valid_entry(VMG_ uint entry) const
{
    CVmObjLookupTable *ltab;
    vm_val_t coll;

    /* get my lookup table object */
    get_coll_val(&coll);
    ltab = (CVmObjLookupTable *)vm_objp(vmg_ coll.val.obj);

    /* if we're already past the last item, we have nothing to find */
    if (entry > ltab->get_entry_count())
        return 0;

    /* 
     *   scan entries until we find one with a non-empty key (an empty key
     *   value indicates that the entry is free) 
     */
    for ( ; entry <= ltab->get_entry_count() ; ++entry)
    {
        vm_lookup_val *entryp;

        /* translate the 1-based index to an entry pointer */
        entryp = ltab->get_ext()->idx_to_val(entry - 1);

        /* if it's non-empty, this is the one we want */
        if (entryp->key.typ != VM_EMPTY)
            return entry;
    }

    /* we didn't find a valid entry */
    return 0;
}